

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgList<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::load_ffmpeg_external
          (CImgList<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  CImg<unsigned_char> *pCVar3;
  bool bVar4;
  CImgArgumentException *this_00;
  char *pcVar5;
  FILE *__stream;
  ulong __maxlen;
  char *pcVar6;
  char *pcVar7;
  CImg<char> *pCVar8;
  char *pcVar9;
  uint *puVar10;
  uchar *puVar11;
  CImgIOException *this_01;
  CImgException *anon_var_0;
  CImg<unsigned_char> img;
  uint local_d8;
  bool stop_flag;
  uint i;
  uint omode;
  CImg<char> local_b0;
  FILE *local_90;
  FILE *file;
  CImg<char> filename_tmp2;
  CImg<char> filename_tmp;
  CImg<char> command;
  char *filename_local;
  CImgList<unsigned_char> *this_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_allocated_width;
    pCVar3 = this->_data;
    pcVar5 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::load_ffmpeg_external(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar5);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  __stream = cimg::fopen(filename,"rb");
  cimg::fclose(__stream);
  CImg<char>::CImg((CImg<char> *)&filename_tmp._data,0x400,1,1,1);
  CImg<char>::CImg((CImg<char> *)&filename_tmp2._data,0x100,1,1,1);
  CImg<char>::CImg((CImg<char> *)&file,0x100,1,1,1);
  local_90 = (FILE *)0x0;
  do {
    pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp2._data);
    __maxlen = (ulong)(uint)filename_tmp2._data;
    pcVar6 = cimg::temporary_path((char *)0x0,false);
    pcVar7 = cimg::filenamerand();
    snprintf(pcVar5,__maxlen,"%s%c%s",pcVar6,0x2f,pcVar7);
    pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    snprintf(pcVar5,(ulong)(uint)file,"%s_000001.ppm",filename_tmp._16_8_);
    pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    local_90 = (FILE *)cimg::std_fopen(pcVar5,"rb");
    if (local_90 != (FILE *)0x0) {
      cimg::fclose(local_90);
    }
  } while (local_90 != (FILE *)0x0);
  pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
  snprintf(pcVar5,(ulong)(uint)file,"%s_%%6d.ppm");
  pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  pcVar6 = cimg::ffmpeg_path((char *)0x0,false);
  CImg<char>::string(&local_b0,filename,true,false);
  pCVar8 = CImg<char>::_system_strescape(&local_b0);
  pcVar7 = CImg<char>::data(pCVar8);
  pcVar9 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
  CImg<char>::string((CImg<char> *)&i,pcVar9,true,false);
  pCVar8 = CImg<char>::_system_strescape((CImg<char> *)&i);
  pcVar9 = CImg<char>::data(pCVar8);
  snprintf(pcVar5,(ulong)(uint)filename_tmp._data,"%s -i \"%s\" \"%s\"",pcVar6,pcVar7,pcVar9);
  CImg<char>::~CImg((CImg<char> *)&i);
  CImg<char>::~CImg(&local_b0);
  pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&filename_tmp._data);
  cimg::system(pcVar5);
  puVar10 = cimg::exception_mode();
  uVar1 = *puVar10;
  cimg::exception_mode(0);
  assign(this);
  local_d8 = 1;
  img._data._7_1_ = 0;
  while (((img._data._7_1_ ^ 0xff) & 1) != 0) {
    pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    snprintf(pcVar5,(ulong)(uint)file,"%s_%.6u.ppm",filename_tmp._16_8_,(ulong)local_d8);
    CImg<unsigned_char>::CImg((CImg<unsigned_char> *)&anon_var_0);
    pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    CImg<unsigned_char>::load_pnm((CImg<unsigned_char> *)&anon_var_0,pcVar5);
    puVar11 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&anon_var_0);
    if (puVar11 != (uchar *)0x0) {
      CImg<unsigned_char>::move_to<unsigned_char>
                ((CImg<unsigned_char> *)&anon_var_0,this,0xffffffff);
      pcVar5 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
      remove(pcVar5);
    }
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)&anon_var_0);
    local_d8 = local_d8 + 1;
  }
  cimg::exception_mode(uVar1);
  bVar4 = is_empty(this);
  if (!bVar4) {
    CImg<char>::~CImg((CImg<char> *)&file);
    CImg<char>::~CImg((CImg<char> *)&filename_tmp2._data);
    CImg<char>::~CImg((CImg<char> *)&filename_tmp._data);
    return this;
  }
  this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_allocated_width;
  pCVar3 = this->_data;
  pcVar5 = pixel_type();
  CImgIOException::CImgIOException
            (this_01,
             "[instance(%u,%u,%p)] CImgList<%s>::load_ffmpeg_external(): Failed to open file \'%s\' with external command \'ffmpeg\'."
             ,(ulong)uVar1,(ulong)uVar2,pCVar3,pcVar5,filename);
  __cxa_throw(this_01,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

CImgList<T>& load_ffmpeg_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimglist_instance
                                    "load_ffmpeg_external(): Specified filename is (null).",
                                    cimglist_instance);
      cimg::fclose(cimg::fopen(filename,"rb")); // Check if file exists
      CImg<charT> command(1024), filename_tmp(256), filename_tmp2(256);
      std::FILE *file = 0;
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_000001.ppm",filename_tmp._data);
        if ((file=cimg::std_fopen(filename_tmp2,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_%%6d.ppm",filename_tmp._data);
      cimg_snprintf(command,command._width,"%s -i \"%s\" \"%s\"",
                    cimg::ffmpeg_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp2)._system_strescape().data());
      cimg::system(command,0);
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      assign();
      unsigned int i = 1;
      for (bool stop_flag = false; !stop_flag; ++i) {
        cimg_snprintf(filename_tmp2,filename_tmp2._width,"%s_%.6u.ppm",filename_tmp._data,i);
        CImg<T> img;
        try { img.load_pnm(filename_tmp2); }
        catch (CImgException&) { stop_flag = true; }
        if (img) { img.move_to(*this); std::remove(filename_tmp2); }
      }
      cimg::exception_mode(omode);
      if (is_empty())
        throw CImgIOException(_cimglist_instance
                              "load_ffmpeg_external(): Failed to open file '%s' with external command 'ffmpeg'.",
                              cimglist_instance,
                              filename);
      return *this;
    }